

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O3

void UnloadDehSupp(void)

{
  bool bVar1;
  FStringTable *pFVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  
  iVar3 = DehUseCount + -1;
  bVar1 = DehUseCount < 2;
  DehUseCount = iVar3;
  if (bVar1) {
    if (MBFParamStates.Count != 0) {
      lVar4 = 8;
      uVar5 = 0;
      do {
        SetDehParams(*(FState **)((long)MBFParamStates.Array + lVar4 + -8),
                     *(int *)((long)&(MBFParamStates.Array)->state + lVar4));
        uVar5 = uVar5 + 1;
        lVar4 = lVar4 + 0x10;
      } while (uVar5 < MBFParamStates.Count);
      if (MBFParamStates.Count != 0) {
        MBFParamStates.Count = 0;
      }
    }
    TArray<MBFParamState,_MBFParamState>::ShrinkToFit(&MBFParamStates);
    if (MBFCodePointers.Count != 0) {
      MBFCodePointers.Count = 0;
    }
    TArray<CodePointerAlias,_CodePointerAlias>::ShrinkToFit(&MBFCodePointers);
    DehUseCount = 0;
    if (Actions.Count != 0) {
      Actions.Count = 0;
    }
    TArray<PFunction_*,_PFunction_*>::ShrinkToFit(&Actions);
    if (OrgHeights.Count != 0) {
      OrgHeights.Count = 0;
    }
    TArray<int,_int>::ShrinkToFit(&OrgHeights);
    if (CodePConv.Count != 0) {
      CodePConv.Count = 0;
    }
    TArray<int,_int>::ShrinkToFit(&CodePConv);
    if (OrgSprNames.Count != 0) {
      OrgSprNames.Count = 0;
    }
    TArray<DEHSprName,_DEHSprName>::ShrinkToFit(&OrgSprNames);
    if (SoundMap.Count != 0) {
      SoundMap.Count = 0;
    }
    TArray<FSoundID,_FSoundID>::ShrinkToFit(&SoundMap);
    if (InfoNames.Count != 0) {
      InfoNames.Count = 0;
    }
    TArray<PClassActor_*,_PClassActor_*>::ShrinkToFit(&InfoNames);
    if (BitNames.Count != 0) {
      BitNames.Count = 0;
    }
    TArray<BitName,_BitName>::ShrinkToFit(&BitNames);
    if (StyleNames.Count != 0) {
      StyleNames.Count = 0;
    }
    TArray<StyleName,_StyleName>::ShrinkToFit(&StyleNames);
    if (AmmoNames.Count != 0) {
      AmmoNames.Count = 0;
    }
    TArray<PClassAmmo_*,_PClassAmmo_*>::ShrinkToFit(&AmmoNames);
    if (UnchangedSpriteNames != (char *)0x0) {
      operator_delete__(UnchangedSpriteNames);
      UnchangedSpriteNames = (char *)0x0;
      NumUnchangedSprites = 0;
    }
    pFVar2 = EnglishStrings;
    if (EnglishStrings != (FStringTable *)0x0) {
      FStringTable::~FStringTable(EnglishStrings);
      operator_delete(pFVar2,0x400);
      EnglishStrings = (FStringTable *)0x0;
    }
  }
  return;
}

Assistant:

static void UnloadDehSupp ()
{
	if (--DehUseCount <= 0)
	{
		// Handle MBF params here, before the required arrays are cleared
		for (unsigned int i=0; i < MBFParamStates.Size(); i++)
		{
			SetDehParams(MBFParamStates[i].state, MBFParamStates[i].pointer);
		}
		MBFParamStates.Clear();
		MBFParamStates.ShrinkToFit();
		MBFCodePointers.Clear();
		MBFCodePointers.ShrinkToFit();
		// StateMap is not freed here, because if you load a second
		// dehacked patch through some means other than including it
		// in the first patch, it won't see the state information
		// that was altered by the first. So we need to keep the
		// StateMap around until all patches have been applied.
		DehUseCount = 0;
		Actions.Clear();
		Actions.ShrinkToFit();
		OrgHeights.Clear();
		OrgHeights.ShrinkToFit();
		CodePConv.Clear();
		CodePConv.ShrinkToFit();
		OrgSprNames.Clear();
		OrgSprNames.ShrinkToFit();
		SoundMap.Clear();
		SoundMap.ShrinkToFit();
		InfoNames.Clear();
		InfoNames.ShrinkToFit();
		BitNames.Clear();
		BitNames.ShrinkToFit();
		StyleNames.Clear();
		StyleNames.ShrinkToFit();
		AmmoNames.Clear();
		AmmoNames.ShrinkToFit();

		if (UnchangedSpriteNames != NULL)
		{
			delete[] UnchangedSpriteNames;
			UnchangedSpriteNames = NULL;
			NumUnchangedSprites = 0;
		}
		if (EnglishStrings != NULL)
		{
			delete EnglishStrings;
			EnglishStrings = NULL;
		}
	}
}